

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::UpdateParser::~UpdateParser(UpdateParser *this)

{
  UpdateParser *this_local;
  
  ~UpdateParser(this);
  operator_delete(this,0x278);
  return;
}

Assistant:

UpdateParser(cmCTestSVN* svn, const char* prefix)
    : SVN(svn)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexUpdate.compile("^([ADUCGE ])([ADUCGE ])[B ] +(.+)$");
  }